

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase179::~TestCase179(TestCase179 *this)

{
  TestCase179 *this_local;
  
  TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

TEST(Arena, Alignment) {
  Arena arena;

  char& c = arena.allocate<char>();
  long& l = arena.allocate<long>();
  char& c2 = arena.allocate<char>();
  ArrayPtr<char> arr = arena.allocateArray<char>(8);

  EXPECT_EQ(alignof(long) + sizeof(long), implicitCast<size_t>(&c2 - &c));
  EXPECT_EQ(alignof(long), implicitCast<size_t>(reinterpret_cast<char*>(&l) - &c));
  EXPECT_EQ(sizeof(char), implicitCast<size_t>(arr.begin() - &c2));
}